

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int fts5VocabTableType(char *zType,char **pzErr,int *peType)

{
  int iVar1;
  char *z;
  char *pcVar2;
  char *zCopy;
  int *piStack_20;
  int rc;
  int *peType_local;
  char **pzErr_local;
  char *zType_local;
  
  zCopy._4_4_ = 0;
  piStack_20 = peType;
  peType_local = (int *)pzErr;
  pzErr_local = (char **)zType;
  z = sqlite3Fts5Strndup((int *)((long)&zCopy + 4),zType,-1);
  if (zCopy._4_4_ == 0) {
    sqlite3Fts5Dequote(z);
    iVar1 = sqlite3_stricmp(z,"col");
    if (iVar1 == 0) {
      *piStack_20 = 0;
    }
    else {
      iVar1 = sqlite3_stricmp(z,"row");
      if (iVar1 == 0) {
        *piStack_20 = 1;
      }
      else {
        iVar1 = sqlite3_stricmp(z,"instance");
        if (iVar1 == 0) {
          *piStack_20 = 2;
        }
        else {
          pcVar2 = sqlite3_mprintf("fts5vocab: unknown table type: %Q",z);
          *(char **)peType_local = pcVar2;
          zCopy._4_4_ = 1;
        }
      }
    }
    sqlite3_free(z);
  }
  return zCopy._4_4_;
}

Assistant:

static int fts5VocabTableType(const char *zType, char **pzErr, int *peType){
  int rc = SQLITE_OK;
  char *zCopy = sqlite3Fts5Strndup(&rc, zType, -1);
  if( rc==SQLITE_OK ){
    sqlite3Fts5Dequote(zCopy);
    if( sqlite3_stricmp(zCopy, "col")==0 ){
      *peType = FTS5_VOCAB_COL;
    }else

    if( sqlite3_stricmp(zCopy, "row")==0 ){
      *peType = FTS5_VOCAB_ROW;
    }else
    if( sqlite3_stricmp(zCopy, "instance")==0 ){
      *peType = FTS5_VOCAB_INSTANCE;
    }else
    {
      *pzErr = sqlite3_mprintf("fts5vocab: unknown table type: %Q", zCopy);
      rc = SQLITE_ERROR;
    }
    sqlite3_free(zCopy);
  }

  return rc;
}